

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int aom_wiener_denoise_2d
              (uint8_t **data,uint8_t **denoised,int w,int h,int *stride,int *chroma_sub,
              float **noise_psd,int block_size,int bit_depth,int use_highbd)

{
  size_t size;
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  int i;
  uint uVar6;
  void *__s;
  void *memblk;
  float *data_00;
  double *block;
  double *plane;
  float *memblk_00;
  aom_noise_tx_t *noise_tx;
  float *memblk_01;
  aom_noise_tx_t *noise_tx_00;
  ulong uVar7;
  byte bVar8;
  float *pfVar9;
  void *pvVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  float *pfVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  aom_noise_tx_t *local_178;
  int local_16c;
  int local_15c;
  aom_flat_block_finder_t *local_c0;
  aom_flat_block_finder_t local_80;
  aom_flat_block_finder_t local_58;
  
  iVar2 = (block_size + w + -1) / block_size;
  iVar3 = (block_size + h + -1) / block_size;
  if (*chroma_sub == chroma_sub[1]) {
    uVar14 = (iVar2 + 2) * block_size;
    iVar25 = (iVar3 + 2) * block_size;
    uVar6 = aom_flat_block_finder_init(&local_58,block_size,bit_depth,use_highbd);
    __s = aom_malloc((long)(int)(iVar25 * uVar14) << 2);
    uVar24 = block_size * block_size;
    memblk = aom_malloc((ulong)uVar24 * 4);
    data_00 = (float *)aom_memalign(0x20,(long)(int)(uVar24 * 2) << 2);
    size = (ulong)uVar24 * 8;
    block = (double *)aom_malloc(size);
    plane = (double *)aom_malloc(size);
    memblk_00 = get_half_cos_window(block_size);
    noise_tx = aom_noise_tx_malloc(block_size);
    noise_tx_00 = noise_tx;
    memblk_01 = memblk_00;
    if (*chroma_sub != 0) {
      uVar24 = aom_flat_block_finder_init
                         (&local_80,block_size >> ((byte)*chroma_sub & 0x1f),bit_depth,use_highbd);
      uVar6 = uVar6 & uVar24;
      memblk_01 = get_half_cos_window(block_size >> ((byte)*chroma_sub & 0x1f));
      noise_tx_00 = aom_noise_tx_malloc(block_size >> ((byte)*chroma_sub & 0x1f));
    }
    auVar35._0_4_ = -(uint)((int)memblk_00 == 0);
    auVar35._4_4_ = -(uint)((int)((ulong)memblk_00 >> 0x20) == 0);
    auVar35._8_4_ = -(uint)((int)memblk_01 == 0);
    auVar35._12_4_ = -(uint)((int)((ulong)memblk_01 >> 0x20) == 0);
    auVar38._4_4_ = auVar35._0_4_;
    auVar38._0_4_ = auVar35._4_4_;
    auVar38._8_4_ = auVar35._12_4_;
    auVar38._12_4_ = auVar35._8_4_;
    auVar37._0_4_ = -(uint)((int)data_00 == 0);
    auVar37._4_4_ = -(uint)((int)((ulong)data_00 >> 0x20) == 0);
    auVar37._8_4_ = -(uint)((int)block == 0);
    auVar37._12_4_ = -(uint)((int)((ulong)block >> 0x20) == 0);
    auVar36._4_4_ = auVar37._0_4_;
    auVar36._0_4_ = auVar37._4_4_;
    auVar36._8_4_ = auVar37._12_4_;
    auVar36._12_4_ = auVar37._8_4_;
    auVar37 = packssdw(auVar36 & auVar37,auVar38 & auVar35);
    auVar33._0_4_ = -(uint)((int)memblk == 0);
    auVar33._4_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0);
    auVar33._8_4_ = -(uint)((int)plane == 0);
    auVar33._12_4_ = -(uint)((int)((ulong)plane >> 0x20) == 0);
    auVar34._4_4_ = auVar33._0_4_;
    auVar34._0_4_ = auVar33._4_4_;
    auVar34._8_4_ = auVar33._12_4_;
    auVar34._12_4_ = auVar33._8_4_;
    auVar31._0_4_ = -(uint)((int)noise_tx == 0);
    auVar31._4_4_ = -(uint)((int)((ulong)noise_tx >> 0x20) == 0);
    auVar31._8_4_ = -(uint)((int)noise_tx_00 == 0);
    auVar31._12_4_ = -(uint)((int)((ulong)noise_tx_00 >> 0x20) == 0);
    auVar30._4_4_ = auVar31._0_4_;
    auVar30._0_4_ = auVar31._4_4_;
    auVar30._8_4_ = auVar31._12_4_;
    auVar30._12_4_ = auVar31._8_4_;
    auVar31 = packssdw(auVar30 & auVar31,auVar34 & auVar33);
    auVar31 = packssdw(auVar31,auVar37);
    if (__s == (void *)0x0) {
      uVar6 = 0;
    }
    if ((((((((auVar31 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar31 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar31 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar31 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0')
    {
      uVar6 = 0;
    }
    if (uVar6 != 0) {
      fVar32 = (float)~(-1 << ((byte)bit_depth & 0x1f));
      lVar11 = 0;
      do {
        iVar16 = 0;
        bVar12 = 0;
        pfVar5 = memblk_00;
        local_178 = noise_tx;
        if (lVar11 != 0) {
          iVar16 = *chroma_sub;
          bVar12 = (byte)chroma_sub[1];
          pfVar5 = memblk_01;
          if (0 < iVar16) {
            local_178 = noise_tx_00;
          }
        }
        if ((data[lVar11] != (uint8_t *)0x0) && (denoised[lVar11] != (uint8_t *)0x0)) {
          local_c0 = &local_58;
          if ((lVar11 != 0) && (local_c0 = &local_80, *chroma_sub == 0)) {
            local_c0 = &local_58;
          }
          memset(__s,0,(long)iVar25 * (long)(int)uVar14 * 4);
          uVar24 = block_size >> (bVar12 & 0x1f);
          bVar8 = (byte)iVar16;
          if (0 < (int)uVar24) {
            uVar15 = block_size >> (bVar8 & 0x1f);
            uVar27 = uVar24 * uVar15;
            uVar22 = (ulong)uVar27;
            lVar13 = (long)(int)uVar15;
            local_15c = 0;
            do {
              if (0 < (int)uVar15) {
                local_16c = 0;
                do {
                  if (-1 < iVar3) {
                    iVar16 = -1;
                    do {
                      if (-1 < iVar2) {
                        uVar23 = (ulong)(((iVar16 + 1) * uVar24 + local_15c) * uVar14 + local_16c);
                        iVar18 = -1;
                        do {
                          aom_flat_block_finder_extract_block
                                    (local_c0,data[lVar11],w >> (bVar8 & 0x1f),h >> (bVar12 & 0x1f),
                                     stride[lVar11],uVar15 * iVar18 + local_16c,
                                     iVar16 * uVar24 + local_15c,plane,block);
                          if ((int)uVar27 < 1) {
LAB_002a2a67:
                            aom_noise_tx_forward(local_178,data_00);
                            aom_noise_tx_filter(local_178,noise_psd[lVar11]);
                            aom_noise_tx_inverse(local_178,data_00);
                          }
                          else {
                            uVar7 = 0;
                            do {
                              data_00[uVar7] = (float)block[uVar7];
                              *(float *)((long)memblk + uVar7 * 4) = (float)plane[uVar7];
                              uVar7 = uVar7 + 1;
                            } while (uVar22 != uVar7);
                            if ((int)uVar27 < 1) goto LAB_002a2a67;
                            uVar7 = 0;
                            do {
                              data_00[uVar7] = pfVar5[uVar7] * data_00[uVar7];
                              uVar7 = uVar7 + 1;
                            } while (uVar22 != uVar7);
                            aom_noise_tx_forward(local_178,data_00);
                            aom_noise_tx_filter(local_178,noise_psd[lVar11]);
                            aom_noise_tx_inverse(local_178,data_00);
                            uVar7 = 0;
                            do {
                              *(float *)((long)memblk + uVar7 * 4) =
                                   pfVar5[uVar7] * *(float *)((long)memblk + uVar7 * 4);
                              uVar7 = uVar7 + 1;
                            } while (uVar22 != uVar7);
                          }
                          iVar18 = iVar18 + 1;
                          uVar19 = 0;
                          uVar7 = uVar23;
                          pfVar9 = data_00;
                          pvVar10 = memblk;
                          pfVar17 = pfVar5;
                          do {
                            uVar20 = 0;
                            do {
                              lVar21 = (long)((int)uVar7 + (int)uVar20);
                              *(float *)((long)__s + lVar21 * 4) =
                                   (pfVar9[uVar20] + *(float *)((long)pvVar10 + uVar20 * 4)) *
                                   pfVar17[uVar20] + *(float *)((long)__s + lVar21 * 4);
                              uVar20 = uVar20 + 1;
                            } while (uVar15 != uVar20);
                            uVar19 = uVar19 + 1;
                            pfVar17 = pfVar17 + lVar13;
                            pvVar10 = (void *)((long)pvVar10 + lVar13 * 4);
                            pfVar9 = pfVar9 + lVar13;
                            uVar7 = uVar7 + uVar14;
                          } while (uVar19 != uVar24);
                          uVar23 = uVar23 + uVar15;
                        } while (iVar18 != iVar2);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != iVar3);
                  }
                  local_16c = local_16c + ((int)(uVar15 - (block_size >> 0x1f)) >> 1);
                } while (local_16c < (int)uVar15);
              }
              local_15c = local_15c + (uVar24 >> 1);
            } while (local_15c < (int)uVar24);
          }
          uVar15 = h >> (bVar12 & 0x1f);
          puVar1 = denoised[lVar11];
          if (use_highbd == 0) {
            if (0 < (int)uVar15) {
              iVar16 = stride[lVar11];
              uVar27 = w >> (bVar8 & 0x1f);
              iVar18 = block_size >> (bVar8 & 0x1f);
              uVar22 = 0;
              do {
                if (0 < (int)uVar27) {
                  iVar26 = ((int)uVar22 + uVar24 + 1) * uVar14 + iVar18;
                  uVar23 = 0;
                  do {
                    iVar4 = (int)uVar23;
                    lVar13 = (long)(int)((uVar24 + (int)uVar22) * uVar14 + iVar18 + iVar4);
                    fVar29 = *(float *)((long)__s + lVar13 * 4);
                    fVar28 = fVar29 * fVar32 + 0.5;
                    if (fVar28 <= 0.0) {
                      fVar28 = 0.0;
                    }
                    if (fVar32 <= fVar28) {
                      fVar28 = fVar32;
                    }
                    fVar29 = (float)((int)fVar28 & 0xff) / fVar32 - fVar29;
                    puVar1[uVar23 + uVar22 * (long)iVar16] = (uint8_t)(int)fVar28;
                    uVar7 = uVar23 + 1;
                    if ((long)uVar7 < (long)(int)uVar27) {
                      *(float *)((long)__s + lVar13 * 4 + 4) =
                           fVar29 * -7.0 * 0.0625 + *(float *)((long)__s + lVar13 * 4 + 4);
                    }
                    if ((long)(uVar22 + 1) < (long)(ulong)uVar15) {
                      if (uVar23 == 0) {
                        lVar13 = (long)(iVar4 + iVar26);
                      }
                      else {
                        lVar13 = (long)(iVar4 + iVar26);
                        *(float *)((long)__s + lVar13 * 4 + -4) =
                             fVar29 * -3.0 * 0.0625 + *(float *)((long)__s + lVar13 * 4 + -4);
                      }
                      *(float *)((long)__s + lVar13 * 4) =
                           fVar29 * -5.0 * 0.0625 + *(float *)((long)__s + lVar13 * 4);
                      if ((long)uVar7 < (long)(int)uVar27) {
                        *(float *)((long)__s + lVar13 * 4 + 4) =
                             fVar29 * -0.0625 + *(float *)((long)__s + lVar13 * 4 + 4);
                      }
                    }
                    uVar23 = uVar7;
                  } while (uVar27 != uVar7);
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar15);
            }
          }
          else if (0 < (int)uVar15) {
            iVar16 = stride[lVar11];
            uVar27 = w >> (bVar8 & 0x1f);
            iVar18 = block_size >> (bVar8 & 0x1f);
            uVar22 = 0;
            do {
              if (0 < (int)uVar27) {
                iVar26 = ((int)uVar22 + uVar24 + 1) * uVar14 + iVar18;
                uVar23 = 0;
                do {
                  iVar4 = (int)uVar23;
                  lVar13 = (long)(int)((uVar24 + (int)uVar22) * uVar14 + iVar18 + iVar4);
                  fVar29 = *(float *)((long)__s + lVar13 * 4);
                  fVar28 = fVar29 * fVar32 + 0.5;
                  if (fVar28 <= 0.0) {
                    fVar28 = 0.0;
                  }
                  if (fVar32 <= fVar28) {
                    fVar28 = fVar32;
                  }
                  fVar29 = (float)((int)fVar28 & 0xffff) / fVar32 - fVar29;
                  *(short *)(puVar1 + uVar23 * 2 + uVar22 * (long)iVar16 * 2) = (short)(int)fVar28;
                  uVar7 = uVar23 + 1;
                  if ((long)uVar7 < (long)(int)uVar27) {
                    *(float *)((long)__s + lVar13 * 4 + 4) =
                         fVar29 * -7.0 * 0.0625 + *(float *)((long)__s + lVar13 * 4 + 4);
                  }
                  if ((long)(uVar22 + 1) < (long)(ulong)uVar15) {
                    if (uVar23 == 0) {
                      lVar13 = (long)(iVar4 + iVar26);
                    }
                    else {
                      lVar13 = (long)(iVar4 + iVar26);
                      *(float *)((long)__s + lVar13 * 4 + -4) =
                           fVar29 * -3.0 * 0.0625 + *(float *)((long)__s + lVar13 * 4 + -4);
                    }
                    *(float *)((long)__s + lVar13 * 4) =
                         fVar29 * -5.0 * 0.0625 + *(float *)((long)__s + lVar13 * 4);
                    if ((long)uVar7 < (long)(int)uVar27) {
                      *(float *)((long)__s + lVar13 * 4 + 4) =
                           fVar29 * -0.0625 + *(float *)((long)__s + lVar13 * 4 + 4);
                    }
                  }
                  uVar23 = uVar7;
                } while (uVar27 != uVar7);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar15);
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
    }
    aom_free(__s);
    aom_free(memblk);
    aom_free(data_00);
    aom_free(plane);
    aom_free(block);
    aom_free(memblk_00);
    aom_noise_tx_free(noise_tx);
    aom_free(local_58.A);
    aom_free(local_58.AtA_inv);
    if (*chroma_sub != 0) {
      aom_free(local_80.A);
      aom_free(local_80.AtA_inv);
      aom_free(memblk_01);
      aom_noise_tx_free(noise_tx_00);
    }
  }
  else {
    aom_wiener_denoise_2d_cold_1();
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

int aom_wiener_denoise_2d(const uint8_t *const data[3], uint8_t *denoised[3],
                          int w, int h, int stride[3], int chroma_sub[2],
                          float *noise_psd[3], int block_size, int bit_depth,
                          int use_highbd) {
  float *plane = NULL, *block = NULL, *window_full = NULL,
        *window_chroma = NULL;
  double *block_d = NULL, *plane_d = NULL;
  struct aom_noise_tx_t *tx_full = NULL;
  struct aom_noise_tx_t *tx_chroma = NULL;
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  const int result_stride = (num_blocks_w + 2) * block_size;
  const int result_height = (num_blocks_h + 2) * block_size;
  float *result = NULL;
  int init_success = 1;
  aom_flat_block_finder_t block_finder_full;
  aom_flat_block_finder_t block_finder_chroma;
  const float kBlockNormalization = (float)((1 << bit_depth) - 1);
  if (chroma_sub[0] != chroma_sub[1]) {
    fprintf(stderr,
            "aom_wiener_denoise_2d doesn't handle different chroma "
            "subsampling\n");
    return 0;
  }
  init_success &= aom_flat_block_finder_init(&block_finder_full, block_size,
                                             bit_depth, use_highbd);
  result = (float *)aom_malloc((num_blocks_h + 2) * block_size * result_stride *
                               sizeof(*result));
  plane = (float *)aom_malloc(block_size * block_size * sizeof(*plane));
  block =
      (float *)aom_memalign(32, 2 * block_size * block_size * sizeof(*block));
  block_d = (double *)aom_malloc(block_size * block_size * sizeof(*block_d));
  plane_d = (double *)aom_malloc(block_size * block_size * sizeof(*plane_d));
  window_full = get_half_cos_window(block_size);
  tx_full = aom_noise_tx_malloc(block_size);

  if (chroma_sub[0] != 0) {
    init_success &= aom_flat_block_finder_init(&block_finder_chroma,
                                               block_size >> chroma_sub[0],
                                               bit_depth, use_highbd);
    window_chroma = get_half_cos_window(block_size >> chroma_sub[0]);
    tx_chroma = aom_noise_tx_malloc(block_size >> chroma_sub[0]);
  } else {
    window_chroma = window_full;
    tx_chroma = tx_full;
  }

  init_success &= (tx_full != NULL) && (tx_chroma != NULL) && (plane != NULL) &&
                  (plane_d != NULL) && (block != NULL) && (block_d != NULL) &&
                  (window_full != NULL) && (window_chroma != NULL) &&
                  (result != NULL);
  for (int c = init_success ? 0 : 3; c < 3; ++c) {
    float *window_function = c == 0 ? window_full : window_chroma;
    aom_flat_block_finder_t *block_finder = &block_finder_full;
    const int chroma_sub_h = c > 0 ? chroma_sub[1] : 0;
    const int chroma_sub_w = c > 0 ? chroma_sub[0] : 0;
    struct aom_noise_tx_t *tx =
        (c > 0 && chroma_sub[0] > 0) ? tx_chroma : tx_full;
    if (!data[c] || !denoised[c]) continue;
    if (c > 0 && chroma_sub[0] != 0) {
      block_finder = &block_finder_chroma;
    }
    memset(result, 0, sizeof(*result) * result_stride * result_height);
    // Do overlapped block processing (half overlapped). The block rows can
    // easily be done in parallel
    for (int offsy = 0; offsy < (block_size >> chroma_sub_h);
         offsy += (block_size >> chroma_sub_h) / 2) {
      for (int offsx = 0; offsx < (block_size >> chroma_sub_w);
           offsx += (block_size >> chroma_sub_w) / 2) {
        // Pad the boundary when processing each block-set.
        for (int by = -1; by < num_blocks_h; ++by) {
          for (int bx = -1; bx < num_blocks_w; ++bx) {
            const int pixels_per_block =
                (block_size >> chroma_sub_w) * (block_size >> chroma_sub_h);
            aom_flat_block_finder_extract_block(
                block_finder, data[c], w >> chroma_sub_w, h >> chroma_sub_h,
                stride[c], bx * (block_size >> chroma_sub_w) + offsx,
                by * (block_size >> chroma_sub_h) + offsy, plane_d, block_d);
            for (int j = 0; j < pixels_per_block; ++j) {
              block[j] = (float)block_d[j];
              plane[j] = (float)plane_d[j];
            }
            pointwise_multiply(window_function, block, pixels_per_block);
            aom_noise_tx_forward(tx, block);
            aom_noise_tx_filter(tx, noise_psd[c]);
            aom_noise_tx_inverse(tx, block);

            // Apply window function to the plane approximation (we will apply
            // it to the sum of plane + block when composing the results).
            pointwise_multiply(window_function, plane, pixels_per_block);

            for (int y = 0; y < (block_size >> chroma_sub_h); ++y) {
              const int y_result =
                  y + (by + 1) * (block_size >> chroma_sub_h) + offsy;
              for (int x = 0; x < (block_size >> chroma_sub_w); ++x) {
                const int x_result =
                    x + (bx + 1) * (block_size >> chroma_sub_w) + offsx;
                result[y_result * result_stride + x_result] +=
                    (block[y * (block_size >> chroma_sub_w) + x] +
                     plane[y * (block_size >> chroma_sub_w) + x]) *
                    window_function[y * (block_size >> chroma_sub_w) + x];
              }
            }
          }
        }
      }
    }
    if (use_highbd) {
      dither_and_quantize_highbd(result, result_stride, (uint16_t *)denoised[c],
                                 w, h, stride[c], chroma_sub_w, chroma_sub_h,
                                 block_size, kBlockNormalization);
    } else {
      dither_and_quantize_lowbd(result, result_stride, denoised[c], w, h,
                                stride[c], chroma_sub_w, chroma_sub_h,
                                block_size, kBlockNormalization);
    }
  }
  aom_free(result);
  aom_free(plane);
  aom_free(block);
  aom_free(plane_d);
  aom_free(block_d);
  aom_free(window_full);

  aom_noise_tx_free(tx_full);

  aom_flat_block_finder_free(&block_finder_full);
  if (chroma_sub[0] != 0) {
    aom_flat_block_finder_free(&block_finder_chroma);
    aom_free(window_chroma);
    aom_noise_tx_free(tx_chroma);
  }
  return init_success;
}